

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# neon_helper.c
# Opt level: O2

uint32_t helper_neon_cls_s32_arm(uint32_t x)

{
  uint32_t uVar1;
  uint uVar2;
  
  uVar1 = 0x1f;
  for (uVar2 = (int)x >> 0x1f ^ x; uVar2 != 0; uVar2 = uVar2 >> 1) {
    uVar1 = uVar1 - 1;
  }
  return uVar1;
}

Assistant:

uint32_t HELPER(neon_cls_s32)(uint32_t x)
{
    int count;
    if ((int32_t)x < 0)
        x = ~x;
    for (count = 32; x; count--)
        x = x >> 1;
    return count - 1;
}